

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

uint16_t phys_section_add(uc_struct_conflict15 *uc,PhysPageMap *map,MemoryRegionSection *section)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *paPVar4;
  MemoryRegionSection *pMVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  MemoryRegionSection *pMVar8;
  FlatView *pFVar9;
  uc_arch uVar10;
  long lVar11;
  gsize n_blocks;
  
  uVar10 = uc->arch;
  if (uVar10 < 0x4000) {
    if (uVar10 == uc->mode) {
      n_blocks = 0x10;
      if (UC_ARCH_RISCV < uVar10) {
        n_blocks = (gsize)(uVar10 * 2);
      }
      uc->mode = (uc_mode)n_blocks;
      pFVar9 = (FlatView *)g_realloc_n((uc->address_space_memory).current_map,n_blocks,0x40);
      (uc->address_space_memory).current_map = pFVar9;
      uVar10 = uc->arch;
    }
    else {
      pFVar9 = (uc->address_space_memory).current_map;
    }
    lVar11 = (ulong)uVar10 * 0x40;
    uVar2 = *(undefined8 *)map;
    uVar3 = *(undefined8 *)&map->nodes_nb;
    paPVar4 = map->nodes;
    pMVar5 = map->sections;
    uVar6 = *(undefined8 *)(map + 1);
    uVar7 = *(undefined8 *)&map[1].nodes_nb;
    pMVar8 = map[1].sections;
    puVar1 = (undefined8 *)((long)pFVar9 + lVar11 + 0x30);
    *puVar1 = map[1].nodes;
    puVar1[1] = pMVar8;
    puVar1 = (undefined8 *)((long)pFVar9 + lVar11 + 0x20);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)pFVar9 + lVar11 + 0x10);
    *puVar1 = paPVar4;
    puVar1[1] = pMVar5;
    *(undefined8 *)((long)pFVar9 + lVar11) = uVar2;
    ((undefined8 *)((long)pFVar9 + lVar11))[1] = uVar3;
    uVar10 = uc->arch;
    uc->arch = uVar10 + UC_ARCH_ARM;
    return (uint16_t)uVar10;
  }
  __assert_fail("map->sections_nb < TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x345,
                "uint16_t phys_section_add(struct uc_struct *, PhysPageMap *, MemoryRegionSection *)"
               );
}

Assistant:

static uint16_t phys_section_add(struct uc_struct *uc, PhysPageMap *map,
                                 MemoryRegionSection *section)
{
    /* The physical section number is ORed with a page-aligned
     * pointer to produce the iotlb entries.  Thus it should
     * never overflow into the page-aligned value.
     */
    assert(map->sections_nb < TARGET_PAGE_SIZE);

    if (map->sections_nb == map->sections_nb_alloc) {
        map->sections_nb_alloc = MAX(map->sections_nb_alloc * 2, 16);
        map->sections = g_renew(MemoryRegionSection, map->sections,
                                map->sections_nb_alloc);
    }
    map->sections[map->sections_nb] = *section;
    return map->sections_nb++;
}